

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

Matrix4x4 * __thiscall
CMU462::Application::get_world_to_3DH(Matrix4x4 *__return_storage_ptr__,Application *this)

{
  XFormWidget *pXVar1;
  double *pdVar2;
  XFormWidget *pXVar3;
  Matrix4x4 P;
  Matrix4x4 local_218;
  Matrix4x4 local_198;
  Matrix4x4 local_118;
  Matrix4x4 local_98;
  
  local_118.entries[3].z = 0.0;
  local_118.entries[3].w = 0.0;
  local_118.entries[3].x = 0.0;
  local_118.entries[3].y = 0.0;
  local_118.entries[2].z = 0.0;
  local_118.entries[2].w = 0.0;
  local_118.entries[2].x = 0.0;
  local_118.entries[2].y = 0.0;
  local_118.entries[1].z = 0.0;
  local_118.entries[1].w = 0.0;
  local_118.entries[1].x = 0.0;
  local_118.entries[1].y = 0.0;
  local_118.entries[0].z = 0.0;
  local_118.entries[0].w = 0.0;
  local_118.entries[0].x = 0.0;
  local_118.entries[0].y = 0.0;
  local_198.entries[3].z = 0.0;
  local_198.entries[3].w = 0.0;
  local_198.entries[3].x = 0.0;
  local_198.entries[3].y = 0.0;
  local_198.entries[2].z = 0.0;
  local_198.entries[2].w = 0.0;
  local_198.entries[2].x = 0.0;
  local_198.entries[2].y = 0.0;
  local_198.entries[1].z = 0.0;
  local_198.entries[1].w = 0.0;
  local_198.entries[1].x = 0.0;
  local_198.entries[1].y = 0.0;
  local_198.entries[0].z = 0.0;
  local_198.entries[0].w = 0.0;
  local_198.entries[0].x = 0.0;
  local_198.entries[0].y = 0.0;
  local_218.entries[3].z = 0.0;
  local_218.entries[3].w = 0.0;
  local_218.entries[3].x = 0.0;
  local_218.entries[3].y = 0.0;
  local_218.entries[2].z = 0.0;
  local_218.entries[2].w = 0.0;
  local_218.entries[2].x = 0.0;
  local_218.entries[2].y = 0.0;
  local_218.entries[1].z = 0.0;
  local_218.entries[1].w = 0.0;
  local_218.entries[1].x = 0.0;
  local_218.entries[1].y = 0.0;
  local_218.entries[0].z = 0.0;
  local_218.entries[0].w = 0.0;
  local_218.entries[0].x = 0.0;
  local_218.entries[0].y = 0.0;
  pdVar2 = Matrix4x4::operator()(&local_118,0,0);
  glGetDoublev(0xba7,pdVar2);
  pXVar3 = (XFormWidget *)(this->scene->selected).object;
  if (pXVar3 == (XFormWidget *)0x0) {
    Matrix4x4::identity();
  }
  else {
    pXVar1 = this->scene->elementTransform;
    if (pXVar3 == pXVar1) {
      pXVar3 = (XFormWidget *)(pXVar1->target).object;
    }
    (*(pXVar3->super_SceneObject)._vptr_SceneObject[0xb])(&local_218);
  }
  Camera::getTransformation(&local_198,&this->camera);
  Matrix4x4::operator*(&local_98,&local_118,&local_198);
  Matrix4x4::operator*(__return_storage_ptr__,&local_98,&local_218);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Application::get_world_to_3DH() {
  Matrix4x4 P, V, M;
  glGetDoublev(GL_PROJECTION_MATRIX, &P(0, 0));
  auto sel = scene->selected.object;
  if(sel) {
    if(sel == scene->elementTransform)
      M = scene->elementTransform->target.object->getTransformation();
    else
      M = sel->getTransformation();
  }
  else
    M = Matrix4x4::identity();
  V = camera.getTransformation();
  return P * V * M;
}